

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitCloud.c
# Opt level: O0

CloudNode * Kit_TruthToCloud5_rec(CloudManager *dd,uint uTruth,int nVars,int nVarsAll)

{
  uint uVar1;
  uint uTruth_00;
  uint uCof1;
  uint uCof0;
  CloudNode *pCof1;
  CloudNode *pCof0;
  int nVarsAll_local;
  int nVars_local;
  uint uTruth_local;
  CloudManager *dd_local;
  
  if (5 < nVars) {
    __assert_fail("nVars <= 5",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitCloud.c"
                  ,0x40,"CloudNode *Kit_TruthToCloud5_rec(CloudManager *, unsigned int, int, int)");
  }
  if (uTruth == 0) {
    dd_local = (CloudManager *)dd->zero;
  }
  else if (uTruth == 0xffffffff) {
    dd_local = (CloudManager *)dd->one;
  }
  else if (nVars == 1) {
    if (uTruth == Kit_TruthToCloud5_rec::uVars[0]) {
      dd_local = (CloudManager *)dd->vars[nVarsAll + -1];
    }
    else {
      if (uTruth != (Kit_TruthToCloud5_rec::uVars[0] ^ 0xffffffff)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitCloud.c"
                      ,0x4b,
                      "CloudNode *Kit_TruthToCloud5_rec(CloudManager *, unsigned int, int, int)");
      }
      dd_local = (CloudManager *)((ulong)dd->vars[nVarsAll + -1] ^ 1);
    }
  }
  else {
    if (nVars < 2) {
      __assert_fail("nVars > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bool/kit/kitCloud.c"
                    ,0x4e,"CloudNode *Kit_TruthToCloud5_rec(CloudManager *, unsigned int, int, int)"
                   );
    }
    uVar1 = uTruth & (Kit_TruthToCloud5_rec::uVars[nVars + -1] ^ 0xffffffff);
    uVar1 = uVar1 << ((byte)(1 << ((char)nVars - 1U & 0x1f)) & 0x1f) | uVar1;
    uTruth_00 = (uTruth & Kit_TruthToCloud5_rec::uVars[nVars + -1]) >>
                ((byte)(1 << ((char)nVars - 1U & 0x1f)) & 0x1f) |
                uTruth & Kit_TruthToCloud5_rec::uVars[nVars + -1];
    if (uVar1 == uTruth_00) {
      dd_local = (CloudManager *)Kit_TruthToCloud5_rec(dd,uVar1,nVars + -1,nVarsAll);
    }
    else {
      if (uVar1 == (uTruth_00 ^ 0xffffffff)) {
        pCof1 = Kit_TruthToCloud5_rec(dd,uVar1,nVars + -1,nVarsAll);
        _uCof1 = (CloudNode *)((ulong)pCof1 ^ 1);
      }
      else {
        pCof1 = Kit_TruthToCloud5_rec(dd,uVar1,nVars + -1,nVarsAll);
        _uCof1 = Kit_TruthToCloud5_rec(dd,uTruth_00,nVars + -1,nVarsAll);
      }
      dd_local = (CloudManager *)Cloud_MakeNode(dd,nVarsAll - nVars,_uCof1,pCof1);
    }
  }
  return (CloudNode *)dd_local;
}

Assistant:

CloudNode * Kit_TruthToCloud5_rec( CloudManager * dd, unsigned uTruth, int nVars, int nVarsAll )
{
    static unsigned uVars[5] = { 0xAAAAAAAA, 0xCCCCCCCC, 0xF0F0F0F0, 0xFF00FF00, 0xFFFF0000 };
    CloudNode * pCof0, * pCof1;
    unsigned uCof0, uCof1;
    assert( nVars <= 5 );
    if ( uTruth == 0 )
        return dd->zero;
    if ( uTruth == ~0 )
        return dd->one;
    if ( nVars == 1 )
    {
        if ( uTruth == uVars[0] )
            return dd->vars[nVarsAll-1];
        if ( uTruth == ~uVars[0] )
            return Cloud_Not(dd->vars[nVarsAll-1]);
        assert( 0 );
    }
//    Count++;
    assert( nVars > 1 );
    uCof0 = uTruth & ~uVars[nVars-1];
    uCof1 = uTruth &  uVars[nVars-1];
    uCof0 |= uCof0 << (1<<(nVars-1));
    uCof1 |= uCof1 >> (1<<(nVars-1));
    if ( uCof0 == uCof1 )
        return Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
    if ( uCof0 == ~uCof1 )
    {
        pCof0 = Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
        pCof1 = Cloud_Not( pCof0 );
    }
    else
    {
        pCof0 = Kit_TruthToCloud5_rec( dd, uCof0, nVars - 1, nVarsAll );
        pCof1 = Kit_TruthToCloud5_rec( dd, uCof1, nVars - 1, nVarsAll );
    }
    return Cloud_MakeNode( dd, nVarsAll - nVars, pCof1, pCof0 );
}